

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall
bk_lib::pod_vector<Clasp::ConstString,_std::allocator<Clasp::ConstString>_>::push_back
          (pod_vector<Clasp::ConstString,_std::allocator<Clasp::ConstString>_> *this,ConstString *x)

{
  uint uVar1;
  pointer pCVar2;
  int *piVar3;
  RefCount *p;
  
  uVar1 = (this->ebo_).size;
  if (uVar1 < (this->ebo_).cap) {
    pCVar2 = (this->ebo_).buf;
    (this->ebo_).size = uVar1 + 1;
    piVar3 = (int *)x->ref_;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    pCVar2[uVar1].ref_ = (RefType)piVar3;
    return;
  }
  append_realloc(this,1,x);
  return;
}

Assistant:

void push_back(const T& x) {
		if (size() < capacity()) {
			new ((ebo_.buf+ebo_.size++)) T(x);
		}
		else {
			append_realloc(1, x);
		}
	}